

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t zip_read_local_file_header(archive_read *a,archive_entry *entry,zip *zip)

{
  int64_t *piVar1;
  byte bVar2;
  uint32_t uVar3;
  zip_entry *zip_entry;
  int64_t *piVar4;
  size_t min;
  long lVar5;
  int iVar6;
  size_t len;
  ushort uVar7;
  uint16_t uVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  unsigned_long uVar11;
  archive_string_conv *paVar12;
  int *piVar13;
  int64_t iVar14;
  wchar_t *pwVar15;
  size_t sVar16;
  wchar_t *pwVar17;
  ulong uVar18;
  int64_t *offset;
  int64_t *piVar19;
  int64_t *piVar20;
  char *pcVar21;
  uchar *puVar22;
  ulong min_00;
  bool bVar23;
  void *uncompressed_buffer;
  size_t linkname_full_length;
  ulong uStack_40;
  size_t local_38;
  
  zip_entry = zip->entry;
  piVar19 = (int64_t *)zip_entry->compressed_size;
  piVar20 = (int64_t *)zip_entry->uncompressed_size;
  uVar3 = zip_entry->crc32;
  zip->decompress_init = '\0';
  zip->end_of_entry = '\0';
  zip->entry_compressed_bytes_read = 0;
  zip->entry_uncompressed_bytes_read = 0;
  uVar11 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->computed_crc32 = uVar11;
  if ((zip->sconv == (archive_string_conv *)0x0) && (zip->init_default_conversion == 0)) {
    paVar12 = archive_string_default_conversion_for_read(&a->archive);
    zip->sconv_default = paVar12;
    zip->init_default_conversion = 1;
  }
  piVar13 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar13 == (int *)0x0) {
LAB_0010a5d6:
    pcVar21 = "Truncated ZIP file header";
    iVar6 = 0x54;
LAB_0010a5df:
    archive_set_error(&a->archive,iVar6,pcVar21);
    return L'\xffffffe2';
  }
  if (*piVar13 != 0x4034b50) {
    pcVar21 = "Damaged Zip archive";
    iVar6 = -1;
    goto LAB_0010a5df;
  }
  iVar6 = piVar13[1];
  zip_entry->system = *(uchar *)((long)piVar13 + 5);
  uVar7 = *(ushort *)((long)piVar13 + 6);
  zip_entry->zip_flags = uVar7;
  if ((uVar7 & 0x41) != 0) {
    zip->has_encrypted_entries = 1;
    archive_entry_set_is_data_encrypted(entry,'\x01');
    uVar7 = zip_entry->zip_flags;
    if ((~uVar7 & 0x2041) == 0) {
      archive_entry_set_is_metadata_encrypted(entry,'\x01');
      return L'\xffffffe2';
    }
  }
  zip->init_decryption = (byte)uVar7 & 1;
  zip_entry->compression = (uchar)piVar13[2];
  iVar14 = dos_to_unix(*(uint32_t *)((long)piVar13 + 10));
  zip_entry->mtime = iVar14;
  zip_entry->crc32 = *(uint32_t *)((long)piVar13 + 0xe);
  puVar22 = (uchar *)((long)piVar13 + 0x11);
  if ((zip_entry->zip_flags & 8) != 0) {
    puVar22 = (uchar *)((long)piVar13 + 0xb);
  }
  zip_entry->decdat = *puVar22;
  zip_entry->compressed_size = (ulong)*(uint *)((long)piVar13 + 0x12);
  zip_entry->uncompressed_size = (ulong)*(uint *)((long)piVar13 + 0x16);
  min_00 = (ulong)*(ushort *)((long)piVar13 + 0x1a);
  uVar18 = (ulong)*(ushort *)(piVar13 + 7);
  __archive_read_consume(a,0x1e);
  pcVar21 = (char *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
  if (pcVar21 == (char *)0x0) goto LAB_0010a5d6;
  if ((zip_entry->zip_flags & 0x800) == 0) {
    paVar12 = zip->sconv;
    if (paVar12 == (archive_string_conv *)0x0) {
      paVar12 = zip->sconv_default;
    }
  }
  else {
    paVar12 = zip->sconv_utf8;
    if (paVar12 == (archive_string_conv *)0x0) {
      paVar12 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      zip->sconv_utf8 = paVar12;
      if (paVar12 == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
    }
  }
  wVar9 = _archive_entry_copy_pathname_l(entry,pcVar21,min_00,paVar12);
  if (wVar9 == L'\0') {
    wVar9 = L'\0';
LAB_0010a56c:
    __archive_read_consume(a,min_00);
    pcVar21 = (char *)__archive_read_ahead(a,uVar18,(ssize_t *)0x0);
    if (pcVar21 == (char *)0x0) goto LAB_0010a5d6;
    wVar10 = process_extra(a,entry,pcVar21,uVar18,zip_entry);
    if (wVar10 != L'\0') {
      return L'\xffffffe2';
    }
    __archive_read_consume(a,uVar18);
    uVar7 = zip_entry->mode;
    if ((uVar7 & 0xf000) == 0x1000) {
      uVar8 = uVar7 & 0xfff | 0x8000;
LAB_0010a604:
      zip_entry->mode = uVar8;
    }
    else if (uVar7 == 0) {
      uVar8 = 0x1b4;
      goto LAB_0010a604;
    }
    if ((((zip_entry->system == '\0') &&
         (pwVar15 = archive_entry_pathname_w(entry), pwVar15 != (wchar_t *)0x0)) &&
        (pwVar17 = wcschr(pwVar15,L'/'), pwVar17 == (wchar_t *)0x0)) &&
       (pwVar17 = wcschr(pwVar15,L'\\'), pwVar17 != (wchar_t *)0x0)) {
      linkname_full_length = 0;
      uStack_40 = 0;
      local_38 = 0;
      sVar16 = wcslen(pwVar15);
      archive_wstrncat((archive_wstring *)&linkname_full_length,pwVar15,sVar16);
      for (uVar18 = 0; uVar18 < uStack_40; uVar18 = uVar18 + 1) {
        if (*(int *)(linkname_full_length + uVar18 * 4) == 0x5c) {
          *(undefined4 *)(linkname_full_length + uVar18 * 4) = 0x2f;
        }
      }
      archive_entry_copy_pathname_w(entry,(wchar_t *)linkname_full_length);
      archive_wstring_free((archive_wstring *)&linkname_full_length);
    }
    uVar7 = zip_entry->mode;
    offset = (int64_t *)(ulong)(uVar7 & 0xf000);
    if ((short)(uVar7 & 0xf000) != 0x4000) {
      pwVar15 = archive_entry_pathname_w(entry);
      if (pwVar15 == (wchar_t *)0x0) {
        pcVar21 = archive_entry_pathname(entry);
        if (((pcVar21 == (char *)0x0) || (sVar16 = strlen(pcVar21), sVar16 == 0)) ||
           (pcVar21[sVar16 - 1] != '/')) goto LAB_0010a729;
LAB_0010a718:
        uVar7 = zip_entry->mode & 0xfb6 | 0x4049;
      }
      else {
        sVar16 = wcslen(pwVar15);
        if ((sVar16 != 0) && (pwVar15[sVar16 - 1] == L'/')) goto LAB_0010a718;
LAB_0010a729:
        uVar7 = zip_entry->mode;
        if (0xfff < uVar7) goto LAB_0010a73e;
        uVar7 = uVar7 | 0x8000;
      }
      zip_entry->mode = uVar7;
    }
LAB_0010a73e:
    if ((uVar7 & 0xf000) == 0x4000) {
      pwVar15 = archive_entry_pathname_w(entry);
      if (pwVar15 == (wchar_t *)0x0) {
        pcVar21 = archive_entry_pathname(entry);
        if (((pcVar21 != (char *)0x0) && (sVar16 = strlen(pcVar21), sVar16 != 0)) &&
           (pcVar21[sVar16 - 1] != '/')) {
          linkname_full_length = 0;
          uStack_40 = 0;
          local_38 = 0;
          archive_strcat((archive_string *)&linkname_full_length,pcVar21);
          archive_strappend_char((archive_string *)&linkname_full_length,'/');
          archive_entry_set_pathname(entry,(char *)linkname_full_length);
          archive_string_free((archive_string *)&linkname_full_length);
        }
      }
      else {
        sVar16 = wcslen(pwVar15);
        if ((sVar16 != 0) && (pwVar15[sVar16 - 1] != L'/')) {
          linkname_full_length = 0;
          uStack_40 = 0;
          local_38 = 0;
          archive_wstrcat((archive_wstring *)&linkname_full_length,pwVar15);
          archive_wstrappend_wchar((archive_wstring *)&linkname_full_length,L'/');
          archive_entry_copy_pathname_w(entry,(wchar_t *)linkname_full_length);
          archive_wstring_free((archive_wstring *)&linkname_full_length);
        }
      }
    }
    piVar1 = &zip_entry->compressed_size;
    if ((zip_entry->flags & 2) != 0) {
      *(byte *)&zip_entry->zip_flags = (byte)zip_entry->zip_flags & 0xf7;
      if (zip_entry->crc32 == 0) {
        zip_entry->crc32 = uVar3;
      }
      else {
        bVar23 = zip->ignore_crc32 != '\0';
        offset = (int64_t *)CONCAT71((int7)((ulong)offset >> 8),bVar23);
        if (zip_entry->crc32 != uVar3 && !bVar23) {
          archive_set_error(&a->archive,0x54,"Inconsistent CRC32 values");
          wVar9 = L'\xffffffec';
        }
      }
      piVar4 = (int64_t *)*piVar1;
      if ((piVar4 == (int64_t *)0xffffffff) || (piVar4 == (int64_t *)0x0)) {
        *piVar1 = (int64_t)piVar19;
        piVar19 = offset;
      }
      else if (piVar4 != piVar19) {
        archive_set_error(&a->archive,0x54,
                          "Inconsistent compressed size: %jd in central directory, %jd in local header"
                         );
        wVar9 = L'\xffffffec';
      }
      piVar4 = (int64_t *)zip_entry->uncompressed_size;
      if ((piVar4 == (int64_t *)0xffffffff) || (piVar4 == (int64_t *)0x0)) {
        zip_entry->uncompressed_size = (int64_t)piVar20;
        offset = piVar19;
      }
      else {
        offset = piVar20;
        if (piVar4 != piVar20) {
          archive_set_error(&a->archive,0x54,
                            "Inconsistent uncompressed size: %jd in central directory, %jd in local header"
                           );
          wVar9 = L'\xffffffec';
          offset = piVar20;
        }
      }
    }
    archive_entry_set_mode(entry,(uint)zip_entry->mode);
    archive_entry_set_uid(entry,zip_entry->uid);
    archive_entry_set_gid(entry,zip_entry->gid);
    archive_entry_set_mtime(entry,zip_entry->mtime,0);
    archive_entry_set_ctime(entry,zip_entry->ctime,0);
    archive_entry_set_atime(entry,zip_entry->atime,0);
    if ((zip->entry->mode & 0xf000) != 0xa000) {
      lVar5 = zip_entry->uncompressed_size;
      if (((zip_entry->zip_flags & 8) == 0) || (lVar5 != 0xffffffff && 0 < lVar5)) {
        archive_entry_set_size(entry,lVar5);
      }
      goto LAB_0010a97b;
    }
    min = *piVar1;
    if ((long)min < 0x10001) {
      archive_entry_set_size(entry,0);
      bVar2 = zip->entry->compression;
      linkname_full_length = min;
      if (bVar2 == 0) {
        pcVar21 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
      }
      else {
        uncompressed_buffer = (void *)0x0;
        if (bVar2 == 0xe) {
          zip->entry_bytes_remaining = *piVar1;
          wVar10 = zip_read_data_zipx_lzma_alone
                             (a,&uncompressed_buffer,&linkname_full_length,offset);
        }
        else {
          if (bVar2 != 8) goto LAB_0010aaee;
          zip->entry_bytes_remaining = *piVar1;
          wVar10 = zip_read_data_deflate(a,&uncompressed_buffer,&linkname_full_length,offset);
        }
        pcVar21 = (char *)uncompressed_buffer;
        if (wVar10 != L'\0') {
          bVar2 = zip->entry->compression;
LAB_0010aaee:
          pcVar21 = compression_name((uint)bVar2);
          archive_set_error(&a->archive,0x54,
                            "Unsupported ZIP compression method during decompression of link entry (%d: %s)"
                            ,(ulong)(uint)bVar2,pcVar21);
          return L'\xffffffe7';
        }
      }
      len = linkname_full_length;
      if (pcVar21 == (char *)0x0) {
        pcVar21 = "Truncated Zip file";
      }
      else {
        paVar12 = zip->sconv;
        if ((paVar12 == (archive_string_conv *)0x0) &&
           (((zip->entry->zip_flags & 0x800) == 0 ||
            (paVar12 = zip->sconv_utf8, paVar12 == (archive_string_conv *)0x0)))) {
          paVar12 = zip->sconv_default;
        }
        wVar10 = _archive_entry_copy_symlink_l(entry,pcVar21,linkname_full_length,paVar12);
        if (wVar10 != L'\0') {
          piVar13 = __errno_location();
          if ((*piVar13 == 0xc) ||
             (((paVar12 == zip->sconv_utf8 && ((zip->entry->zip_flags & 0x800) != 0)) &&
              (_archive_entry_copy_symlink_l(entry,pcVar21,len,(archive_string_conv *)0x0),
              *piVar13 == 0xc)))) {
            pcVar21 = "Can\'t allocate memory for Symlink";
            goto LAB_0010a52f;
          }
          if ((paVar12 != zip->sconv_utf8) || ((zip->entry->zip_flags & 0x800) == 0)) {
            pcVar21 = archive_string_conversion_charset_name(paVar12);
            archive_set_error(&a->archive,0x54,
                              "Symlink cannot be converted from %s to current locale.",pcVar21);
            wVar9 = L'\xffffffec';
          }
        }
        *piVar1 = 0;
        zip_entry->uncompressed_size = 0;
        iVar14 = __archive_read_consume(a,min);
        if (-1 < iVar14) {
LAB_0010a97b:
          lVar5 = zip_entry->compressed_size;
          zip->entry_bytes_remaining = lVar5;
          if (lVar5 < 1 && (zip_entry->zip_flags & 8) == 0) {
            zip->end_of_entry = '\x01';
          }
          (zip->format_name).length = 0;
          pcVar21 = compression_name((uint)zip->entry->compression);
          archive_string_sprintf
                    (&zip->format_name,"ZIP %d.%d (%s)",(ulong)(uint)(int)(char)((char)iVar6 / '\n')
                     ,(ulong)(uint)(int)(char)((char)iVar6 % '\n'),pcVar21);
          (a->archive).archive_format_name = (zip->format_name).s;
          return wVar9;
        }
        pcVar21 = "Read error skipping symlink target name";
      }
    }
    else {
      pcVar21 = "Zip file with oversized link entry";
    }
    iVar6 = -1;
  }
  else {
    piVar13 = __errno_location();
    if (*piVar13 != 0xc) {
      wVar9 = L'\xffffffec';
      pcVar21 = archive_string_conversion_charset_name(paVar12);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar21);
      goto LAB_0010a56c;
    }
    pcVar21 = "Can\'t allocate memory for Pathname";
LAB_0010a52f:
    iVar6 = 0xc;
  }
  archive_set_error(&a->archive,iVar6,pcVar21);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_local_file_header(struct archive_read *a, struct archive_entry *entry,
    struct zip *zip)
{
	const char *p;
	const void *h;
	const wchar_t *wp;
	const char *cp;
	size_t len, filename_length, extra_length;
	struct archive_string_conv *sconv;
	struct zip_entry *zip_entry = zip->entry;
	struct zip_entry zip_entry_central_dir;
	int ret = ARCHIVE_OK;
	char version;

	/* Save a copy of the original for consistency checks. */
	zip_entry_central_dir = *zip_entry;

	zip->decompress_init = 0;
	zip->end_of_entry = 0;
	zip->entry_uncompressed_bytes_read = 0;
	zip->entry_compressed_bytes_read = 0;
	zip->computed_crc32 = zip->crc32func(0, NULL, 0);

	/* Setup default conversion. */
	if (zip->sconv == NULL && !zip->init_default_conversion) {
		zip->sconv_default =
		    archive_string_default_conversion_for_read(&(a->archive));
		zip->init_default_conversion = 1;
	}

	if ((p = __archive_read_ahead(a, 30, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (memcmp(p, "PK\003\004", 4) != 0) {
		archive_set_error(&a->archive, -1, "Damaged Zip archive");
		return ARCHIVE_FATAL;
	}
	version = p[4];
	zip_entry->system = p[5];
	zip_entry->zip_flags = archive_le16dec(p + 6);
	if (zip_entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)) {
		zip->has_encrypted_entries = 1;
		archive_entry_set_is_data_encrypted(entry, 1);
		if (zip_entry->zip_flags & ZIP_CENTRAL_DIRECTORY_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_STRONG_ENCRYPTED) {
			archive_entry_set_is_metadata_encrypted(entry, 1);
			return ARCHIVE_FATAL;
		}
	}
	zip->init_decryption = (zip_entry->zip_flags & ZIP_ENCRYPTED);
	zip_entry->compression = (char)archive_le16dec(p + 8);
	zip_entry->mtime = dos_to_unix(archive_le32dec(p + 10));
	zip_entry->crc32 = archive_le32dec(p + 14);
	if (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
		zip_entry->decdat = p[11];
	else
		zip_entry->decdat = p[17];
	zip_entry->compressed_size = archive_le32dec(p + 18);
	zip_entry->uncompressed_size = archive_le32dec(p + 22);
	filename_length = archive_le16dec(p + 26);
	extra_length = archive_le16dec(p + 28);

	__archive_read_consume(a, 30);

	/* Read the filename. */
	if ((h = __archive_read_ahead(a, filename_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}
	if (zip_entry->zip_flags & ZIP_UTF8_NAME) {
		/* The filename is stored to be UTF-8. */
		if (zip->sconv_utf8 == NULL) {
			zip->sconv_utf8 =
			    archive_string_conversion_from_charset(
				&a->archive, "UTF-8", 1);
			if (zip->sconv_utf8 == NULL)
				return (ARCHIVE_FATAL);
		}
		sconv = zip->sconv_utf8;
	} else if (zip->sconv != NULL)
		sconv = zip->sconv;
	else
		sconv = zip->sconv_default;

	if (archive_entry_copy_pathname_l(entry,
	    h, filename_length, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	__archive_read_consume(a, filename_length);

	/* Read the extra data. */
	if ((h = __archive_read_ahead(a, extra_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (ARCHIVE_OK != process_extra(a, entry, h, extra_length,
	    zip_entry)) {
		return ARCHIVE_FATAL;
	}
	__archive_read_consume(a, extra_length);

	/* Work around a bug in Info-Zip: When reading from a pipe, it
	 * stats the pipe instead of synthesizing a file entry. */
	if ((zip_entry->mode & AE_IFMT) == AE_IFIFO) {
		zip_entry->mode &= ~ AE_IFMT;
		zip_entry->mode |= AE_IFREG;
	}

	/* If the mode is totally empty, set some sane default. */
	if (zip_entry->mode == 0) {
		zip_entry->mode |= 0664;
	}

	/* Windows archivers sometimes use backslash as the directory
	 * separator. Normalize to slash. */
	if (zip_entry->system == 0 &&
	    (wp = archive_entry_pathname_w(entry)) != NULL) {
		if (wcschr(wp, L'/') == NULL && wcschr(wp, L'\\') != NULL) {
			size_t i;
			struct archive_wstring s;
			archive_string_init(&s);
			archive_wstrcpy(&s, wp);
			for (i = 0; i < archive_strlen(&s); i++) {
				if (s.s[i] == '\\')
					s.s[i] = '/';
			}
			archive_entry_copy_pathname_w(entry, s.s);
			archive_wstring_free(&s);
		}
	}

	/* Make sure that entries with a trailing '/' are marked as directories
	 * even if the External File Attributes contains bogus values.  If this
	 * is not a directory and there is no type, assume a regular file. */
	if ((zip_entry->mode & AE_IFMT) != AE_IFDIR) {
		int has_slash;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			has_slash = len > 0 && wp[len - 1] == L'/';
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			has_slash = len > 0 && cp[len - 1] == '/';
		}
		/* Correct file type as needed. */
		if (has_slash) {
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFDIR;
			zip_entry->mode |= 0111;
		} else if ((zip_entry->mode & AE_IFMT) == 0) {
			zip_entry->mode |= AE_IFREG;
		}
	}

	/* Make sure directories end in '/' */
	if ((zip_entry->mode & AE_IFMT) == AE_IFDIR) {
		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			if (len > 0 && wp[len - 1] != L'/') {
				struct archive_wstring s;
				archive_string_init(&s);
				archive_wstrcat(&s, wp);
				archive_wstrappend_wchar(&s, L'/');
				archive_entry_copy_pathname_w(entry, s.s);
				archive_wstring_free(&s);
			}
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			if (len > 0 && cp[len - 1] != '/') {
				struct archive_string s;
				archive_string_init(&s);
				archive_strcat(&s, cp);
				archive_strappend_char(&s, '/');
				archive_entry_set_pathname(entry, s.s);
				archive_string_free(&s);
			}
		}
	}

	if (zip_entry->flags & LA_FROM_CENTRAL_DIRECTORY) {
		/* If this came from the central dir, its size info
		 * is definitive, so ignore the length-at-end flag. */
		zip_entry->zip_flags &= ~ZIP_LENGTH_AT_END;
		/* If local header is missing a value, use the one from
		   the central directory.  If both have it, warn about
		   mismatches. */
		if (zip_entry->crc32 == 0) {
			zip_entry->crc32 = zip_entry_central_dir.crc32;
		} else if (!zip->ignore_crc32
		    && zip_entry->crc32 != zip_entry_central_dir.crc32) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent CRC32 values");
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->compressed_size == 0
		    || zip_entry->compressed_size == 0xffffffff) {
			zip_entry->compressed_size
			    = zip_entry_central_dir.compressed_size;
		} else if (zip_entry->compressed_size
		    != zip_entry_central_dir.compressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent compressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.compressed_size,
			    (intmax_t)zip_entry->compressed_size);
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->uncompressed_size == 0 ||
			zip_entry->uncompressed_size == 0xffffffff) {
			zip_entry->uncompressed_size
			    = zip_entry_central_dir.uncompressed_size;
		} else if (zip_entry->uncompressed_size
		    != zip_entry_central_dir.uncompressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent uncompressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.uncompressed_size,
			    (intmax_t)zip_entry->uncompressed_size);
			ret = ARCHIVE_WARN;
		}
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	archive_entry_set_uid(entry, zip_entry->uid);
	archive_entry_set_gid(entry, zip_entry->gid);
	archive_entry_set_mtime(entry, zip_entry->mtime, 0);
	archive_entry_set_ctime(entry, zip_entry->ctime, 0);
	archive_entry_set_atime(entry, zip_entry->atime, 0);

	if ((zip->entry->mode & AE_IFMT) == AE_IFLNK) {
		size_t linkname_length;

		if (zip_entry->compressed_size > 64 * 1024) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Zip file with oversized link entry");
			return ARCHIVE_FATAL;
		}

		linkname_length = (size_t)zip_entry->compressed_size;

		archive_entry_set_size(entry, 0);

		// take into account link compression if any
		size_t linkname_full_length = linkname_length;
		if (zip->entry->compression != 0)
		{
			// symlink target string appeared to be compressed
			int status = ARCHIVE_FATAL;
			const void *uncompressed_buffer = NULL;

			switch (zip->entry->compression)
			{
#if HAVE_ZLIB_H
				case 8: /* Deflate compression. */
					zip->entry_bytes_remaining = zip_entry->compressed_size;
					status = zip_read_data_deflate(a, &uncompressed_buffer,
						&linkname_full_length, NULL);
					break;
#endif
#if HAVE_LZMA_H && HAVE_LIBLZMA
				case 14: /* ZIPx LZMA compression. */
					/*(see zip file format specification, section 4.4.5)*/
					zip->entry_bytes_remaining = zip_entry->compressed_size;
					status = zip_read_data_zipx_lzma_alone(a, &uncompressed_buffer,
						&linkname_full_length, NULL);
					break;
#endif
				default: /* Unsupported compression. */
					break;
			}
			if (status == ARCHIVE_OK)
			{
				p = uncompressed_buffer;
			}
			else
			{
				archive_set_error(&a->archive,
					ARCHIVE_ERRNO_FILE_FORMAT,
					"Unsupported ZIP compression method "
					"during decompression of link entry (%d: %s)",
					zip->entry->compression,
					compression_name(zip->entry->compression));
				return ARCHIVE_FAILED;
			}
		}
		else
		{
			p = __archive_read_ahead(a, linkname_length, NULL);
		}

		if (p == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated Zip file");
			return ARCHIVE_FATAL;
		}

		sconv = zip->sconv;
		if (sconv == NULL && (zip->entry->zip_flags & ZIP_UTF8_NAME))
			sconv = zip->sconv_utf8;
		if (sconv == NULL)
			sconv = zip->sconv_default;
		if (archive_entry_copy_symlink_l(entry, p, linkname_full_length,
		    sconv) != 0) {
			if (errno != ENOMEM && sconv == zip->sconv_utf8 &&
			    (zip->entry->zip_flags & ZIP_UTF8_NAME))
			    archive_entry_copy_symlink_l(entry, p,
				linkname_full_length, NULL);
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symlink");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Since there is no character-set regulation for
			 * symlink name, do not report the conversion error
			 * in an automatic conversion.
			 */
			if (sconv != zip->sconv_utf8 ||
			    (zip->entry->zip_flags & ZIP_UTF8_NAME) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symlink cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
					sconv));
				ret = ARCHIVE_WARN;
			}
		}
		zip_entry->uncompressed_size = zip_entry->compressed_size = 0;

		if (__archive_read_consume(a, linkname_length) < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Read error skipping symlink target name");
			return ARCHIVE_FATAL;
		}
	} else if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	   || (zip_entry->uncompressed_size > 0
	       && zip_entry->uncompressed_size != 0xffffffff)) {
		/* Set the size only if it's meaningful. */
		archive_entry_set_size(entry, zip_entry->uncompressed_size);
	}
	zip->entry_bytes_remaining = zip_entry->compressed_size;

	/* If there's no body, force read_data() to return EOF immediately. */
	if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	/* Set up a more descriptive format name. */
        archive_string_empty(&zip->format_name);
	archive_string_sprintf(&zip->format_name, "ZIP %d.%d (%s)",
	    version / 10, version % 10,
	    compression_name(zip->entry->compression));
	a->archive.archive_format_name = zip->format_name.s;

	return (ret);
}